

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign.cpp
# Opt level: O1

int __thiscall
ncnn::ROIAlign::forward
          (ROIAlign *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  uint _c;
  uint uVar5;
  pointer pMVar6;
  Mat *this_00;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar38 [16];
  ulong local_120;
  void *local_118;
  void *local_110;
  ulong local_e0;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = pMVar6->w;
  iVar4 = pMVar6->h;
  _c = pMVar6->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->pooled_width,this->pooled_height,_c,pMVar6->elemsize,opt->blob_allocator
             );
  iVar17 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    fVar41 = this->spatial_scale;
    auVar38._0_8_ = *pMVar6[1].data;
    uVar2 = *(undefined8 *)((long)pMVar6[1].data + 8);
    fVar27 = (float)auVar38._0_8_ * fVar41;
    fVar30 = (float)((ulong)auVar38._0_8_ >> 0x20) * fVar41;
    fVar31 = fVar41 * 0.0;
    fVar32 = fVar41 * 0.0;
    fVar37 = (float)uVar2 * fVar41;
    fVar39 = (float)((ulong)uVar2 >> 0x20) * fVar41;
    fVar40 = fVar41 * 0.0;
    fVar41 = fVar41 * 0.0;
    bVar23 = this->aligned != false;
    if (bVar23) {
      fVar27 = fVar27 + -0.5;
      fVar30 = fVar30 + -0.5;
      fVar31 = fVar31 + 0.0;
      fVar32 = fVar32 + 0.0;
      fVar37 = fVar37 + -0.5;
      fVar39 = fVar39 + -0.5;
      fVar40 = fVar40 + 0.0;
      fVar41 = fVar41 + 0.0;
    }
    auVar38._0_8_ = CONCAT44(fVar39 - fVar30,fVar37 - fVar27);
    auVar38._8_4_ = fVar40 - fVar31;
    auVar38._12_4_ = fVar41 - fVar32;
    if (!bVar23) {
      auVar38 = maxps(auVar38,_DAT_0031b440);
    }
    fVar31 = (float)auVar38._0_8_ / (float)this->pooled_width;
    fVar41 = (float)((ulong)auVar38._0_8_ >> 0x20) / (float)this->pooled_height;
    if (this->version == 1) {
      iVar17 = this->sampling_ratio;
      if (iVar17 < 1) {
        fVar32 = ceilf(fVar41);
        fVar37 = ceilf(fVar31);
      }
      else {
        fVar32 = (float)iVar17;
        fVar37 = (float)iVar17;
      }
      if ((int)_c < 1) {
        return 0;
      }
      iVar12 = (int)fVar32;
      iVar11 = (int)fVar37;
      iVar17 = 1;
      if (1 < iVar11 * iVar12) {
        iVar17 = iVar11 * iVar12;
      }
      uVar5 = this->pooled_width;
      iVar15 = this->pooled_height;
      pvVar7 = pMVar6->data;
      sVar8 = pMVar6->cstep;
      sVar9 = pMVar6->elemsize;
      local_120 = 0;
      do {
        if (0 < iVar15) {
          lVar14 = sVar8 * sVar9 * local_120;
          local_118 = (void *)(this_00->cstep * local_120 * this_00->elemsize + (long)this_00->data)
          ;
          iVar10 = 0;
          do {
            if (0 < (int)uVar5) {
              uVar21 = 0;
              do {
                if (iVar12 < 1) {
                  fVar32 = 0.0;
                }
                else {
                  fVar32 = 0.0;
                  iVar18 = 0;
                  do {
                    if (0 < iVar11) {
                      fVar37 = ((float)iVar18 + 0.5) * fVar41 * (1.0 / (float)iVar12) +
                               (float)iVar10 * fVar41 + fVar30;
                      iVar13 = 0;
                      do {
                        if ((((-1.0 <= fVar37) && (fVar37 <= (float)iVar4)) &&
                            (fVar39 = ((float)iVar13 + 0.5) * fVar31 * (1.0 / (float)iVar11) +
                                      (float)(int)uVar21 * fVar31 + fVar27, -1.0 <= fVar39)) &&
                           (fVar39 <= (float)iVar3)) {
                          fVar40 = 0.0;
                          if (fVar37 <= 0.0) {
                            fVar37 = 0.0;
                          }
                          if (fVar39 <= 0.0) {
                            fVar39 = 0.0;
                          }
                          iVar16 = (int)fVar39;
                          iVar19 = iVar16 + 1;
                          iVar20 = (int)fVar37 + 1;
                          if (iVar19 < iVar3) {
                            fVar26 = fVar39 - (float)(int)fVar39;
                            if (iVar19 < iVar3) goto LAB_002ba048;
LAB_002ba06c:
                            fVar39 = 1.0;
                          }
                          else {
                            fVar26 = 0.0;
                            if (iVar3 <= iVar19) goto LAB_002ba06c;
LAB_002ba048:
                            fVar39 = (float)iVar19 - fVar39;
                          }
                          if (iVar3 <= iVar19) {
                            iVar19 = iVar3 + -1;
                          }
                          if (iVar20 < iVar4) {
                            fVar24 = (float)iVar20 - fVar37;
                            fVar40 = fVar37 - (float)(int)fVar37;
                          }
                          else {
                            fVar24 = 1.0;
                            iVar20 = iVar4 + -1;
                          }
                          iVar22 = (int)fVar37 * iVar3;
                          fVar32 = (*(float *)((long)pvVar7 + (long)(iVar22 + iVar19) * 4 + lVar14)
                                    * fVar26 +
                                   *(float *)((long)pvVar7 + (long)(iVar22 + iVar16) * 4 + lVar14) *
                                   fVar39) * fVar24 + fVar32 +
                                   (fVar26 * *(float *)((long)pvVar7 +
                                                       (long)(iVar20 * iVar3 + iVar19) * 4 + lVar14)
                                   + fVar39 * *(float *)((long)pvVar7 +
                                                        (long)(iVar16 + iVar20 * iVar3) * 4 + lVar14
                                                        )) * fVar40;
                        }
                        iVar13 = iVar13 + 1;
                      } while (iVar11 != iVar13);
                    }
                    iVar18 = iVar18 + 1;
                  } while (iVar18 != iVar12);
                }
                *(float *)((long)local_118 + uVar21 * 4) = fVar32 * (1.0 / (float)iVar17);
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar5);
            }
            local_118 = (void *)((long)local_118 + (long)(int)uVar5 * 4);
            iVar10 = iVar10 + 1;
          } while (iVar10 != iVar15);
        }
        local_120 = local_120 + 1;
      } while (local_120 != _c);
    }
    else {
      if (this->version != 0) {
        return 0;
      }
      if ((int)_c < 1) {
        return 0;
      }
      uVar5 = this->pooled_width;
      iVar17 = this->pooled_height;
      fVar32 = (float)iVar4;
      fVar37 = (float)iVar3;
      pvVar7 = pMVar6->data;
      sVar8 = pMVar6->cstep;
      sVar9 = pMVar6->elemsize;
      local_e0 = 0;
      do {
        if (0 < iVar17) {
          lVar14 = sVar8 * sVar9 * local_e0;
          local_110 = (void *)(this_00->cstep * local_e0 * this_00->elemsize + (long)this_00->data);
          iVar12 = this->sampling_ratio;
          iVar11 = 0;
          do {
            if (0 < (int)uVar5) {
              fVar39 = (float)iVar11 * fVar41 + fVar30;
              fVar40 = (float)(iVar11 + 1) * fVar41 + fVar30;
              if (fVar39 <= 0.0) {
                fVar39 = 0.0;
              }
              if (fVar32 <= fVar39) {
                fVar39 = fVar32;
              }
              if (fVar40 <= 0.0) {
                fVar40 = 0.0;
              }
              if (fVar32 <= fVar40) {
                fVar40 = fVar32;
              }
              fVar24 = ceilf(fVar40 - fVar39);
              fVar26 = (float)iVar12;
              if (iVar12 < 1) {
                fVar26 = fVar24;
              }
              iVar15 = (int)fVar26;
              uVar21 = 0;
              do {
                uVar1 = uVar21 + 1;
                fVar36 = (float)(int)uVar21 * fVar31 + fVar27;
                fVar24 = (float)(int)uVar1 * fVar31 + fVar27;
                if (fVar36 <= 0.0) {
                  fVar36 = 0.0;
                }
                if (fVar37 <= fVar36) {
                  fVar36 = fVar37;
                }
                if (fVar24 <= 0.0) {
                  fVar24 = 0.0;
                }
                if (fVar37 <= fVar24) {
                  fVar24 = fVar37;
                }
                fVar25 = (float)iVar12;
                if (iVar12 < 1) {
                  fVar25 = ceilf(fVar24 - fVar36);
                }
                iVar10 = (int)fVar25;
                fVar25 = 0.0;
                fVar34 = 0.0;
                if (0 < iVar15) {
                  fVar34 = 0.0;
                  iVar18 = 0;
                  do {
                    if (0 < iVar10) {
                      fVar28 = ((float)iVar18 + 0.5) * fVar41 * (1.0 / (float)(int)fVar26) + fVar39;
                      iVar13 = (int)fVar28 + 1;
                      if (iVar13 < iVar4) {
                        fVar33 = (float)iVar13 - fVar28;
                        if (iVar13 < iVar4) goto LAB_002b9c6c;
LAB_002b9c8f:
                        fVar29 = 0.0;
                      }
                      else {
                        fVar33 = 1.0;
                        if (iVar4 <= iVar13) goto LAB_002b9c8f;
LAB_002b9c6c:
                        fVar29 = fVar28 - (float)(int)fVar28;
                      }
                      if (iVar4 <= iVar13) {
                        iVar13 = iVar4 + -1;
                      }
                      iVar19 = (int)fVar28 * iVar3;
                      iVar20 = 0;
                      do {
                        fVar28 = ((float)iVar20 + 0.5) * fVar31 * (1.0 / (float)iVar10) + fVar36;
                        iVar22 = (int)fVar28;
                        iVar16 = iVar22 + 1;
                        if (iVar16 < iVar3) {
                          fVar35 = fVar28 - (float)(int)fVar28;
                          if (iVar3 <= iVar16) goto LAB_002b9cce;
LAB_002b9ce4:
                          fVar28 = (float)iVar16 - fVar28;
                        }
                        else {
                          fVar35 = 0.0;
                          if (iVar16 < iVar3) goto LAB_002b9ce4;
LAB_002b9cce:
                          fVar28 = 1.0;
                        }
                        if (iVar3 <= iVar16) {
                          iVar16 = iVar3 + -1;
                        }
                        fVar34 = (fVar35 * *(float *)((long)pvVar7 +
                                                     (long)(iVar16 + iVar13 * iVar3) * 4 + lVar14) +
                                 fVar28 * *(float *)((long)pvVar7 +
                                                    (long)(iVar22 + iVar13 * iVar3) * 4 + lVar14)) *
                                 fVar29 + fVar34 + (*(float *)((long)pvVar7 +
                                                              (long)(iVar16 + iVar19) * 4 + lVar14)
                                                    * fVar35 +
                                                   *(float *)((long)pvVar7 +
                                                             (long)(iVar19 + iVar22) * 4 + lVar14) *
                                                   fVar28) * fVar33;
                        iVar20 = iVar20 + 1;
                      } while (iVar10 != iVar20);
                    }
                    iVar18 = iVar18 + 1;
                  } while (iVar18 != iVar15);
                }
                if (fVar39 < fVar40 && fVar36 < fVar24) {
                  fVar25 = fVar34 / (float)(iVar10 * iVar15);
                }
                *(float *)((long)local_110 + uVar21 * 4) = fVar25;
                uVar21 = uVar1;
              } while (uVar1 != uVar5);
            }
            local_110 = (void *)((long)local_110 + (long)(int)uVar5 * 4);
            iVar11 = iVar11 + 1;
          } while (iVar11 != iVar17);
        }
        local_e0 = local_e0 + 1;
      } while (local_e0 != _c);
    }
    iVar17 = 0;
  }
  return iVar17;
}

Assistant:

int ROIAlign::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: avg pool over R
    const float* roi_ptr = roi_blob;

    float roi_x1 = roi_ptr[0] * spatial_scale;
    float roi_y1 = roi_ptr[1] * spatial_scale;
    float roi_x2 = roi_ptr[2] * spatial_scale;
    float roi_y2 = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_x1 -= 0.5f;
        roi_y1 -= 0.5f;
        roi_x2 -= 0.5f;
        roi_y2 -= 0.5f;
    }

    float roi_w = roi_x2 - roi_x1;
    float roi_h = roi_y2 - roi_y1;

    if (!aligned)
    {
        roi_w = std::max(roi_w, 1.f);
        roi_h = std::max(roi_h, 1.f);
    }

    float bin_size_w = roi_w / (float)pooled_width;
    float bin_size_h = roi_h / (float)pooled_height;

    if (version == 0)
    {
        // original version
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_y1 + ph * bin_size_h;
                    float wstart = roi_x1 + pw * bin_size_w;
                    float hend = roi_y1 + (ph + 1) * bin_size_h;
                    float wend = roi_x1 + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)h);
                    wstart = std::min(std::max(wstart, 0.f), (float)w);
                    hend = std::min(std::max(hend, 0.f), (float)h);
                    wend = std::min(std::max(wend, 0.f), (float)w);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        float y = hstart + (by + 0.5f) * bin_size_h / (float)bin_grid_h;

                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            float x = wstart + (bx + 0.5f) * bin_size_w / (float)bin_grid_w;

                            // bilinear interpolate at (x,y)
                            float v = bilinear_interpolate(ptr, w, h, x, y);

                            sum += v;
                        }
                    }

                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_h / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_w / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float sum = 0.f;
                    for (int by = 0; by < roi_bin_grid_h; by++)
                    {
                        float y = roi_y1 + ph * bin_size_h + (by + 0.5f) * bin_size_h / (float)roi_bin_grid_h;

                        for (int bx = 0; bx < roi_bin_grid_w; bx++)
                        {
                            float x = roi_x1 + pw * bin_size_w + (bx + 0.5f) * bin_size_w / (float)roi_bin_grid_w;

                            if (y < -1.0 || y > h || x < -1.0 || x > w)
                            {
                                // empty
                                continue;
                            }
                            else
                            {
                                if (y <= 0) y = 0;
                                if (x <= 0) x = 0;

                                // bilinear interpolate at (x,y)
                                float v = bilinear_interpolate(ptr, w, h, x, y);
                                sum += v;
                            }
                        }
                    }
                    outptr[pw] = sum / count;
                }

                outptr += pooled_width;
            }
        }
    }

    return 0;
}